

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O3

void PrintName(InstructionVMGraphContext *ctx,VmValue *value,bool fullName,bool noExtraInfo)

{
  VmValueType VVar1;
  _func_int **pp_Var2;
  TypeBase *pTVar3;
  VmValue *value_00;
  VmValue *value_01;
  char *pcVar4;
  _func_int **pp_Var5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  
  if (value == (VmValue *)0x0) {
    Print(ctx,"%%null%%");
    return;
  }
  switch(value->typeID) {
  case 1:
    PrintConstant(ctx,(VmConstant *)value);
    goto LAB_001b12ee;
  case 2:
    if ((fullName) && (value_00 = (VmValue *)value[1].users.data, value_00 != (VmValue *)0x0)) {
      value_01 = (VmValue *)value_00[1].type.structType;
      if (value_01 != (VmValue *)0x0) {
        PrintName(ctx,value_01,true,true);
        Print(ctx,".");
      }
      PrintName(ctx,value_00,true,true);
      Print(ctx,".");
    }
    Print(ctx,"%%%d",(ulong)*(uint *)((long)&value[1]._vptr_VmValue + 4));
    if (*(int *)(value[1].users.little + 7) != 0) {
      Print(ctx,".c%d");
    }
    if ((*(int *)(value[1].users.little + 3) != 0) &&
       (Print(ctx,".r"), *(int *)(value[1].users.little + 3) != 0)) {
      uVar8 = 0;
      do {
        pcVar7 = "|%d";
        if (uVar8 == 0) {
          pcVar7 = "%d";
        }
        Print(ctx,pcVar7,
              (ulong)*(byte *)((long)(value[1].users.little[2]->users).little + (uVar8 - 0x50)));
        uVar8 = uVar8 + 1;
      } while (uVar8 < *(uint *)(value[1].users.little + 3));
    }
    goto LAB_001b12ee;
  case 3:
    pp_Var5 = value[1]._vptr_VmValue;
    uVar6 = value[1].typeID - (int)pp_Var5;
    VVar1 = value[1].type.type;
    pcVar7 = "%.*s.b%d";
    break;
  case 4:
    pp_Var2 = value[1]._vptr_VmValue;
    if (pp_Var2 == (_func_int **)0x0) {
      Print(ctx,"global");
      goto LAB_001b12ee;
    }
    pp_Var5 = *(_func_int ***)(pp_Var2[7] + 0x40);
    uVar6 = *(int *)(pp_Var2[7] + 0x48) - (int)pp_Var5;
    VVar1 = *(VmValueType *)(pp_Var2 + 0xb);
    pcVar7 = "%.*s.f%04x";
    break;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmGraph.cpp"
                  ,0x8e,"void PrintName(InstructionVMGraphContext &, VmValue *, bool, bool)");
  }
  Print(ctx,pcVar7,(ulong)uVar6,pp_Var5,(ulong)VVar1);
LAB_001b12ee:
  if (!noExtraInfo) {
    if (ctx->showFullTypes == true) {
      pTVar3 = (value->type).structType;
      if (pTVar3 == (TypeBase *)0x0) {
        Print(ctx," <");
        PrintType(ctx,value->type);
        Print(ctx,">");
      }
      else {
        Print(ctx," <%.*s>",(ulong)(uint)(*(int *)&(pTVar3->name).end - (int)(pTVar3->name).begin));
      }
    }
    if (ctx->showComments == true) {
      pcVar7 = (value->comment).begin;
      pcVar4 = (value->comment).end;
      if (pcVar7 != pcVar4) {
        Print(ctx," (%.*s)",(ulong)(uint)((int)pcVar4 - (int)pcVar7));
        return;
      }
    }
  }
  return;
}

Assistant:

void PrintName(InstructionVMGraphContext &ctx, VmValue *value, bool fullName, bool noExtraInfo)
{
	if(VmConstant *constant = getType<VmConstant>(value))
	{
		PrintConstant(ctx, constant);
	}
	else if(VmInstruction *inst = getType<VmInstruction>(value))
	{
		if(fullName)
		{
			if(VmBlock *block = inst->parent)
			{
				if(VmFunction *function = block->parent)
				{
					PrintName(ctx, function, true, true);
					Print(ctx, ".");
				}

				PrintName(ctx, block, true, true);
				Print(ctx, ".");
			}
		}

		Print(ctx, "%%%d", inst->uniqueId);

		if(inst->color)
			Print(ctx, ".c%d", inst->color);

		if(!inst->regVmRegisters.empty())
		{
			Print(ctx, ".r");

			for(unsigned i = 0; i < inst->regVmRegisters.size(); i++)
				Print(ctx, i == 0 ? "%d" : "|%d", inst->regVmRegisters[i]);
		}
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		Print(ctx, "%.*s.b%d", FMT_ISTR(block->name), block->uniqueId);
	}
	else if(VmFunction *function = getType<VmFunction>(value))
	{
		if(FunctionData *fData = function->function)
			Print(ctx, "%.*s.f%04x", FMT_ISTR(fData->name->name), fData->uniqueId);
		else
			Print(ctx, "global");
	}
	else if(!value)
	{
		Print(ctx, "%%null%%");

		noExtraInfo = true;
	}
	else
	{
		assert(!"unknown type");
	}

	if(noExtraInfo)
		return;

	if(ctx.showFullTypes)
	{
		if(value->type.structType)
		{
			Print(ctx, " <%.*s>", FMT_ISTR(value->type.structType->name));
		}
		else
		{
			Print(ctx, " <");
			PrintType(ctx, value->type);
			Print(ctx, ">");
		}
	}

	if(ctx.showComments && !value->comment.empty())
		Print(ctx, " (%.*s)", FMT_ISTR(value->comment));
}